

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderLibrary.cpp
# Opt level: O0

MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *
vkt::createShaderLibraryGroup
          (MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
           *__return_storage_ptr__,TestContext *testCtx,string *name,string *description,
          string *filename)

{
  ShaderLibraryGroup *this;
  DefaultDeleter<tcu::TestCaseGroup> local_3d [13];
  string *local_30;
  string *filename_local;
  string *description_local;
  string *name_local;
  TestContext *testCtx_local;
  
  local_30 = filename;
  filename_local = description;
  description_local = name;
  name_local = (string *)testCtx;
  testCtx_local = (TestContext *)__return_storage_ptr__;
  this = (ShaderLibraryGroup *)operator_new(0x90);
  anon_unknown_0::ShaderLibraryGroup::ShaderLibraryGroup
            (this,(TestContext *)name_local,description_local,filename_local,local_30);
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter(local_3d);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            (__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

MovePtr<tcu::TestCaseGroup> createShaderLibraryGroup (tcu::TestContext& testCtx, const string& name, const string& description, const string& filename)
{
	return MovePtr<tcu::TestCaseGroup>(new ShaderLibraryGroup(testCtx, name, description, filename));
}